

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON * cJSON_AddNullToObject(cJSON *object,char *name)

{
  cJSON_bool cVar1;
  cJSON *item;
  cJSON_bool in_R8D;
  
  item = cJSON_CreateNull();
  cVar1 = add_item_to_object(object,name,item,(internal_hooks *)0x0,in_R8D);
  if (cVar1 == 0) {
    cJSON_Delete(item);
    item = (cJSON *)0x0;
  }
  return item;
}

Assistant:

CJSON_PUBLIC(cJSON*) cJSON_AddNullToObject(cJSON * const object, const char * const name)
{
    cJSON *null = cJSON_CreateNull();
    if (add_item_to_object(object, name, null, &global_hooks, false))
    {
        return null;
    }

    cJSON_Delete(null);
    return NULL;
}